

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.c
# Opt level: O0

void add_region(level *lev,region *reg)

{
  region **__src;
  boolean bVar1;
  region **pprVar2;
  int local_28;
  int local_24;
  int j;
  int i;
  region **tmp_reg;
  region *reg_local;
  level *lev_local;
  
  if (lev->max_regions <= lev->n_regions) {
    __src = lev->regions;
    pprVar2 = (region **)malloc((long)(lev->max_regions + 10) << 3);
    lev->regions = pprVar2;
    if (0 < lev->max_regions) {
      memcpy(lev->regions,__src,(long)lev->max_regions << 3);
      free(__src);
    }
    lev->max_regions = lev->max_regions + 10;
  }
  reg->lev = lev;
  lev->regions[lev->n_regions] = reg;
  lev->n_regions = lev->n_regions + 1;
  for (local_24 = (int)(reg->bounding_box).lx; local_24 <= (reg->bounding_box).hx;
      local_24 = local_24 + 1) {
    for (local_28 = (int)(reg->bounding_box).ly; local_28 <= (reg->bounding_box).hy;
        local_28 = local_28 + 1) {
      if ((((0 < local_24) && (local_24 < 0x50)) && (-1 < local_28)) && (local_28 < 0x15)) {
        if (((lev->monsters[local_24][local_28] != (monst *)0x0) &&
            ((*(uint *)&lev->monsters[local_24][local_28]->field_0x60 >> 9 & 1) == 0)) &&
           (bVar1 = inside_region(reg,local_24,local_28), bVar1 != '\0')) {
          add_mon_to_reg(reg,lev->monsters[local_24][local_28]);
        }
        if ((reg->visible != '\0') && ((viz_array[local_28][local_24] & 2U) != 0)) {
          newsym(local_24,local_28);
        }
      }
    }
  }
  bVar1 = inside_region(reg,(int)u.ux,(int)u.uy);
  if (bVar1 == '\0') {
    reg->player_flags = reg->player_flags & 0xfe;
  }
  else {
    reg->player_flags = reg->player_flags | 1;
  }
  return;
}

Assistant:

void add_region(struct level *lev, struct region *reg)
{
    struct region **tmp_reg;
    int i, j;

    if (lev->max_regions <= lev->n_regions) {
	tmp_reg = lev->regions;
	lev->regions = malloc(sizeof (struct region *) * (lev->max_regions + 10));
	if (lev->max_regions > 0) {
	    memcpy(lev->regions, tmp_reg,
			  lev->max_regions * sizeof (struct region *));
	    free(tmp_reg);
	}
	lev->max_regions += 10;
    }
    reg->lev = lev;
    lev->regions[lev->n_regions] = reg;
    lev->n_regions++;
    /* Check for monsters inside the region */
    for (i = reg->bounding_box.lx; i <= reg->bounding_box.hx; i++)
	for (j = reg->bounding_box.ly; j <= reg->bounding_box.hy; j++) {
	    /* Some lev->regions can cross the level boundaries */
	    if (!isok(i,j))
		continue;
	    if (MON_AT(lev, i, j) && inside_region(reg, i, j))
		add_mon_to_reg(reg, lev->monsters[i][j]);
	    if (reg->visible && cansee(i, j))
		newsym(i, j);
	}
    /* Check for player now... */
    if (inside_region(reg, u.ux, u.uy))
	set_hero_inside(reg);
    else
	clear_hero_inside(reg);
}